

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::updateScaleFinal<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double q,double eprev1,double eprev2,double epsilon)

{
  SSVectorBase<double> *vec;
  
  SSVectorBase<double>::operator-=(*pscprev,*psccurr);
  if (ABS(-eprev1 * eprev2) <= epsilon) {
    SSVectorBase<double>::clear(*pscprev);
  }
  else {
    SSVectorBase<double>::operator*=(*pscprev,-eprev1 * eprev2);
  }
  vec = SSVectorBase<double>::assignPWproduct4setup<double,double>(tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<double>::operator+=(*pscprev,vec);
  SSVectorBase<double>::operator*=(*pscprev,1.0 / q);
  SSVectorBase<double>::operator+=(*pscprev,*psccurr);
  *psccurr = *pscprev;
  return;
}

Assistant:

static void updateScaleFinal(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R q,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(q != 0);
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);

   R fac = -(eprev1 * eprev2);

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);
   *pscprev *= 1.0 / q;
   *pscprev += *psccurr;

   psccurr = pscprev;
}